

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O1

char * reverse(char *s)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar3 = strlen(s);
  uVar2 = (int)sVar3 - 1;
  if (uVar2 != 0) {
    uVar6 = 0;
    uVar5 = (ulong)uVar2;
    do {
      uVar4 = uVar5 - 1;
      cVar1 = s[uVar6];
      s[uVar6] = s[uVar5];
      s[uVar5] = cVar1;
      uVar6 = uVar6 + 1;
      uVar5 = uVar4;
    } while (uVar6 < (uVar4 & 0xffffffff));
  }
  return s;
}

Assistant:

char *reverse(char *s) {
    unsigned long len = strlen(s);
    char chr;
    for (uint i = len - 1, j = 0; j < i; --i, j++) {
        chr = s[j];
        s[j] = s[i];
        s[i] = chr;
    }
    return s;
}